

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

RectInfo * __thiscall
ImPlot::GetterHeatmap<unsigned_long_long>::operator()
          (RectInfo *__return_storage_ptr__,GetterHeatmap<unsigned_long_long> *this,int idx)

{
  unsigned_long_long uVar1;
  ImU32 IVar2;
  float t_00;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auStack_38 [4];
  float t;
  ImPlotPoint p;
  int c;
  int r;
  double val;
  int idx_local;
  GetterHeatmap<unsigned_long_long> *this_local;
  
  uVar1 = this->Values[idx];
  auVar4._8_4_ = (int)(uVar1 >> 0x20);
  auVar4._0_8_ = uVar1;
  auVar4._12_4_ = 0x45300000;
  p.y._4_4_ = idx / this->Cols;
  p.y._0_4_ = idx % this->Cols;
  ImPlotPoint::ImPlotPoint
            ((ImPlotPoint *)auStack_38,
             (double)p.y._0_4_ * this->Width + this->XRef + (this->HalfSize).x,
             this->YDir * ((double)p.y._4_4_ * this->Height + (this->HalfSize).y) + this->YRef);
  RectInfo::RectInfo(__return_storage_ptr__);
  (__return_storage_ptr__->Min).x = _auStack_38 - (this->HalfSize).x;
  (__return_storage_ptr__->Min).y = p.x - (this->HalfSize).y;
  (__return_storage_ptr__->Max).x = _auStack_38 + (this->HalfSize).x;
  (__return_storage_ptr__->Max).y = p.x + (this->HalfSize).y;
  dVar3 = ImRemap01<double>((auVar4._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0),
                            this->ScaleMin,this->ScaleMax);
  t_00 = ImClamp<float>((float)dVar3,0.0,1.0);
  IVar2 = ImPlotColormapData::LerpTable(&GImPlot->ColormapData,(GImPlot->Style).Colormap,t_00);
  __return_storage_ptr__->Color = IVar2;
  return __return_storage_ptr__;
}

Assistant:

inline RectInfo operator()(int idx) const {
        double val = (double)Values[idx];
        const int r = idx / Cols;
        const int c = idx % Cols;
        const ImPlotPoint p(XRef + HalfSize.x + c*Width, YRef + YDir * (HalfSize.y + r*Height));
        RectInfo rect;
        rect.Min.x = p.x - HalfSize.x;
        rect.Min.y = p.y - HalfSize.y;
        rect.Max.x = p.x + HalfSize.x;
        rect.Max.y = p.y + HalfSize.y;
        const float t = ImClamp((float)ImRemap01(val, ScaleMin, ScaleMax),0.0f,1.0f);
        rect.Color = GImPlot->ColormapData.LerpTable(GImPlot->Style.Colormap, t);
        return rect;
    }